

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

lys_node * lys_parent(lys_node *node)

{
  lys_node *local_20;
  lys_node *parent;
  lys_node *node_local;
  
  if (node == (lys_node *)0x0) {
    node_local = (lys_node *)0x0;
  }
  else {
    if (node->nodetype == LYS_EXT) {
      if (node->padding[1] != '\x01') {
        return (lys_node *)0x0;
      }
      local_20 = (lys_node *)node->dsc;
    }
    else {
      if (node->parent == (lys_node *)0x0) {
        return (lys_node *)0x0;
      }
      local_20 = node->parent;
    }
    if (local_20->nodetype == LYS_AUGMENT) {
      node_local = local_20->prev;
    }
    else {
      node_local = local_20;
    }
  }
  return node_local;
}

Assistant:

lys_node *
lys_parent(const struct lys_node *node)
{
    struct lys_node *parent;

    if (!node) {
        return NULL;
    }

    if (node->nodetype == LYS_EXT) {
        if (((struct lys_ext_instance_complex*)node)->parent_type != LYEXT_PAR_NODE) {
            return NULL;
        }
        parent = (struct lys_node*)((struct lys_ext_instance_complex*)node)->parent;
    } else if (!node->parent) {
        return NULL;
    } else {
        parent = node->parent;
    }

    if (parent->nodetype == LYS_AUGMENT) {
        return ((struct lys_node_augment *)parent)->target;
    } else {
        return parent;
    }
}